

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LowerMDShared.cpp
# Opt level: O0

void __thiscall
LowererMD::EmitReinterpretIntToFloat(LowererMD *this,Opnd *dst,Opnd *src,Instr *insertBeforeInstr)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  Instr *insertBeforeInstr_local;
  Opnd *src_local;
  Opnd *dst_local;
  LowererMD *this_local;
  
  bVar2 = IR::Opnd::IsFloat(dst);
  if (!bVar2) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/LowerMDShared.cpp"
                       ,0x1dfa,"(dst->IsFloat())","dst->IsFloat()");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 0;
  }
  bVar2 = IR::Opnd::IsInt32(src);
  if (!bVar2) {
    bVar2 = IR::Opnd::IsUInt32(src);
    if (!bVar2) {
      bVar2 = IR::Opnd::IsInt64(src);
      if (!bVar2) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar3 = 1;
        bVar2 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/LowerMDShared.cpp"
                           ,0x1dfb,"(src->IsInt32() || src->IsUInt32() || src->IsInt64())",
                           "src->IsInt32() || src->IsUInt32() || src->IsInt64()");
        if (!bVar2) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar3 = 0;
      }
    }
  }
  EmitReinterpretPrimitive(this,dst,src,insertBeforeInstr);
  return;
}

Assistant:

void LowererMD::EmitReinterpretIntToFloat(IR::Opnd* dst, IR::Opnd* src, IR::Instr* insertBeforeInstr)
{
    Assert(dst->IsFloat());
    Assert(src->IsInt32() || src->IsUInt32() || src->IsInt64());
    EmitReinterpretPrimitive(dst, src, insertBeforeInstr);
}